

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  uint _w;
  ulong uVar9;
  undefined4 *puVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int p_2;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  void *pvVar19;
  void *pvVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  Mat local_88;
  long local_40;
  void *local_38;
  
  _w = kernel_w * kernel_h;
  uVar18 = 0;
  Mat::reshape(&local_88,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 8,inch,outch / 8 + outch % 4 + (int)(char)((char)(outch % 8) / '\x04'),
              4,(Allocator *)0x0);
  sVar1 = kernel_tm->cstep;
  sVar2 = kernel_tm->elemsize;
  uVar9 = (ulong)_w;
  if ((int)_w < 1) {
    uVar9 = uVar18;
  }
  uVar21 = (ulong)(uint)inch;
  if (inch < 1) {
    uVar21 = uVar18;
  }
  pvVar8 = kernel_tm->data;
  lVar4 = (long)outch;
  lVar14 = local_88.elemsize * local_88.cstep;
  lVar7 = 3;
  lVar11 = 2;
  lVar13 = 1;
  pvVar22 = local_88.data;
  for (; (long)(uVar18 | 7) < lVar4; uVar18 = uVar18 + 8) {
    puVar10 = (undefined4 *)((uVar18 >> 3) * sVar1 * sVar2 + (long)pvVar8);
    pvVar16 = pvVar22;
    for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        *puVar10 = *(undefined4 *)((long)pvVar16 + uVar5 * 4);
        lVar23 = lVar14 + uVar5 * 4;
        puVar10[1] = *(undefined4 *)((long)pvVar16 + lVar14 + uVar5 * 4);
        lVar3 = lVar14 + lVar23;
        puVar10[2] = *(undefined4 *)((long)pvVar16 + lVar14 + lVar23);
        lVar23 = lVar14 + lVar3;
        puVar10[3] = *(undefined4 *)((long)pvVar16 + lVar14 + lVar3);
        lVar3 = lVar14 + lVar23;
        puVar10[4] = *(undefined4 *)((long)pvVar16 + lVar14 + lVar23);
        lVar23 = lVar14 + lVar3;
        puVar10[5] = *(undefined4 *)((long)pvVar16 + lVar14 + lVar3);
        puVar10[6] = *(undefined4 *)((long)pvVar16 + lVar14 + lVar23);
        puVar10[7] = *(undefined4 *)((long)pvVar16 + lVar14 * 2 + lVar23);
        puVar10 = puVar10 + 8;
      }
      pvVar16 = (void *)((long)pvVar16 + (long)local_88.w * local_88.elemsize);
    }
    lVar7 = lVar7 + 8;
    lVar11 = lVar11 + 8;
    lVar13 = lVar13 + 8;
    pvVar22 = (void *)((long)pvVar22 + lVar14 * 8);
  }
  local_38 = kernel_tm->data;
  local_40 = kernel_tm->cstep * kernel_tm->elemsize;
  lVar14 = (long)local_88.w * local_88.elemsize;
  lVar23 = local_88.elemsize * local_88.cstep;
  pvVar8 = (void *)(lVar7 * lVar23 + (long)local_88.data);
  lVar7 = lVar23 * 4;
  pvVar22 = (void *)(lVar11 * lVar23 + (long)local_88.data);
  pvVar16 = (void *)(lVar13 * lVar23 + (long)local_88.data);
  pvVar24 = (void *)(lVar23 * uVar18 + (long)local_88.data);
  for (; (long)(uVar18 | 3) < lVar4; uVar18 = uVar18 + 4) {
    pvVar6 = pvVar8;
    pvVar12 = pvVar22;
    pvVar19 = (void *)((ulong)(((uint)(uVar18 >> 3) & 0x1fffffff) +
                              (uint)(((uint)uVar18 >> 2 & 1) != 0)) * local_40 + (long)local_38);
    pvVar20 = pvVar16;
    pvVar25 = pvVar24;
    for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
      pvVar17 = pvVar19;
      for (lVar11 = 0; uVar9 * 4 != lVar11; lVar11 = lVar11 + 4) {
        *(undefined4 *)((long)pvVar19 + lVar11 * 4) = *(undefined4 *)((long)pvVar25 + lVar11);
        *(undefined4 *)((long)pvVar19 + lVar11 * 4 + 4) = *(undefined4 *)((long)pvVar20 + lVar11);
        *(undefined4 *)((long)pvVar19 + lVar11 * 4 + 8) = *(undefined4 *)((long)pvVar12 + lVar11);
        *(undefined4 *)((long)pvVar19 + lVar11 * 4 + 0xc) = *(undefined4 *)((long)pvVar6 + lVar11);
        pvVar17 = (void *)((long)pvVar17 + 0x10);
      }
      pvVar6 = (void *)((long)pvVar6 + lVar14);
      pvVar12 = (void *)((long)pvVar12 + lVar14);
      pvVar20 = (void *)((long)pvVar20 + lVar14);
      pvVar25 = (void *)((long)pvVar25 + lVar14);
      pvVar19 = pvVar17;
    }
    pvVar8 = (void *)((long)pvVar8 + lVar7);
    pvVar22 = (void *)((long)pvVar22 + lVar7);
    pvVar16 = (void *)((long)pvVar16 + lVar7);
    pvVar24 = (void *)((long)pvVar24 + lVar7);
  }
  sVar1 = kernel_tm->cstep;
  sVar2 = kernel_tm->elemsize;
  pvVar8 = kernel_tm->data;
  pvVar22 = (void *)(local_88.cstep * local_88.elemsize * uVar18 + (long)local_88.data);
  for (; (long)uVar18 < lVar4; uVar18 = uVar18 + 1) {
    pvVar24 = (void *)((ulong)(((uint)uVar18 & 3) + ((uint)(uVar18 >> 3) & 0x1fffffff) +
                              (uint)(((uint)uVar18 >> 2 & 1) != 0)) * sVar1 * sVar2 + (long)pvVar8);
    pvVar16 = pvVar22;
    for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
      for (lVar7 = 0; uVar9 * 4 != lVar7; lVar7 = lVar7 + 4) {
        *(undefined4 *)((long)pvVar24 + lVar7) = *(undefined4 *)((long)pvVar16 + lVar7);
      }
      pvVar16 = (void *)((long)pvVar16 + (long)local_88.w * local_88.elemsize);
      pvVar24 = (void *)((long)pvVar24 + lVar7);
    }
    pvVar22 = (void *)((long)pvVar22 + local_88.cstep * local_88.elemsize);
  }
  if (local_88.refcount != (int *)0x0) {
    LOCK();
    *local_88.refcount = *local_88.refcount + -1;
    UNLOCK();
    if (*local_88.refcount == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        free(local_88.data);
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-maxk-inch-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
#if __SSE2__
    kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + q % 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];

                g00 += 1;
            }
        }
    }
#else
    kernel_tm = kernel;
#endif // __SSE2__
}